

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O1

void __thiscall google::anon_unknown_8::LogFileObject::Flush(LogFileObject *this)

{
  FILE *__stream;
  int iVar1;
  long lVar2;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->mutex_);
  if (iVar1 == 0) {
    lVar2 = std::chrono::_V2::system_clock::now();
    __stream = (FILE *)(this->file_)._M_t.
                       super___uniq_ptr_impl<_IO_FILE,_std::default_delete<_IO_FILE>_>._M_t.
                       super__Tuple_impl<0UL,__IO_FILE_*,_std::default_delete<_IO_FILE>_>.
                       super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl;
    if (__stream != (FILE *)0x0) {
      fflush(__stream);
      this->bytes_since_flush_ = 0;
    }
    (this->next_flush_time_).__d.__r = (long)fLI::FLAGS_logbufsecs * 1000000000 + lVar2;
    pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void LogFileObject::Flush() {
  std::lock_guard<std::mutex> l{mutex_};
  FlushUnlocked(std::chrono::system_clock::now());
}